

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlp.cpp
# Opt level: O0

void __thiscall
seeta::fd::MLP::AddLayer
          (MLP *this,int32_t inputDim,int32_t outputDim,float *weights,float *bias,bool is_output)

{
  int32_t iVar1;
  size_type sVar2;
  element_type *this_00;
  MLPLayer *this_01;
  int in_ESI;
  vector<std::shared_ptr<seeta::fd::MLPLayer>,_std::allocator<std::shared_ptr<seeta::fd::MLPLayer>_>_>
  *in_RDI;
  shared_ptr<seeta::fd::MLPLayer> layer;
  undefined8 in_stack_ffffffffffffff98;
  int32_t act_func_type;
  MLPLayer *__p;
  vector<std::shared_ptr<seeta::fd::MLPLayer>,_std::allocator<std::shared_ptr<seeta::fd::MLPLayer>_>_>
  *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  int32_t in_stack_ffffffffffffffc4;
  float *in_stack_ffffffffffffffc8;
  MLPLayer *in_stack_ffffffffffffffd0;
  
  act_func_type = (int32_t)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  sVar2 = std::
          vector<std::shared_ptr<seeta::fd::MLPLayer>,_std::allocator<std::shared_ptr<seeta::fd::MLPLayer>_>_>
          ::size(in_RDI);
  if (sVar2 != 0) {
    std::
    vector<std::shared_ptr<seeta::fd::MLPLayer>,_std::allocator<std::shared_ptr<seeta::fd::MLPLayer>_>_>
    ::back(in_stack_ffffffffffffffa0);
    this_00 = std::
              __shared_ptr_access<seeta::fd::MLPLayer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<seeta::fd::MLPLayer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1461f3);
    iVar1 = MLPLayer::GetOutputDim(this_00);
    in_stack_ffffffffffffffac = in_ESI;
    if (in_ESI != iVar1) {
      return;
    }
  }
  this_01 = (MLPLayer *)operator_new(0x40);
  MLPLayer::MLPLayer(this_01,act_func_type);
  __p = (MLPLayer *)&stack0xffffffffffffffc8;
  std::shared_ptr<seeta::fd::MLPLayer>::shared_ptr<seeta::fd::MLPLayer,void>
            ((shared_ptr<seeta::fd::MLPLayer> *)this_01,__p);
  std::__shared_ptr_access<seeta::fd::MLPLayer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<seeta::fd::MLPLayer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x14624e);
  MLPLayer::SetSize(this_01,(int32_t)((ulong)__p >> 0x20),(int32_t)__p);
  std::__shared_ptr_access<seeta::fd::MLPLayer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<seeta::fd::MLPLayer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x14626a);
  MLPLayer::SetWeights
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  std::__shared_ptr_access<seeta::fd::MLPLayer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<seeta::fd::MLPLayer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x14628e);
  MLPLayer::SetBias(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  std::
  vector<std::shared_ptr<seeta::fd::MLPLayer>,_std::allocator<std::shared_ptr<seeta::fd::MLPLayer>_>_>
  ::push_back(in_RDI,(value_type *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  std::shared_ptr<seeta::fd::MLPLayer>::~shared_ptr((shared_ptr<seeta::fd::MLPLayer> *)0x1462bc);
  return;
}

Assistant:

void MLP::AddLayer(int32_t inputDim, int32_t outputDim, const float* weights,
    const float* bias, bool is_output) {
  if (layers_.size() > 0 && inputDim != layers_.back()->GetOutputDim())
    return;  // @todo handle the errors!!!

  std::shared_ptr<seeta::fd::MLPLayer> layer(new seeta::fd::MLPLayer(is_output ? 0 : 1));
  layer->SetSize(inputDim, outputDim);
  layer->SetWeights(weights, inputDim * outputDim);
  layer->SetBias(bias, outputDim);
  layers_.push_back(layer);
}